

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

bool re2::PCRE::Arg::parse_ulonglong_radix(char *str,int n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  ulonglong uVar2;
  char *end;
  char buf [33];
  char *local_60;
  char local_58 [40];
  
  if ((n != 0) && (__nptr = TerminateNumber(local_58,str,n), *__nptr != '-')) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoull(__nptr,&local_60,radix);
    if ((local_60 == __nptr + n) && (*piVar1 == 0)) {
      if (dest == (void *)0x0) {
        return true;
      }
      *(ulonglong *)dest = uVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool PCRE::Arg::parse_ulonglong_radix(const char* str,
                                    int n,
                                    void* dest,
                                    int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, str, n);
  if (str[0] == '-') {
    // strtoull() will silently accept negative numbers and parse
    // them.  This module is more strict and treats them as errors.
    return false;
  }
  char* end;
  errno = 0;
  uint64 r = strtoull(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<uint64*>(dest)) = r;
  return true;
}